

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O0

cf_void_t hashtbl_remove_node(cf_hashtbl_t *tbl,cf_void_t *key,cf_size_t len)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  hashtbl_node_t **local_68;
  hashtbl_node_t *prev;
  hashtbl_node_t **list_entry;
  hashtbl_node_t *node;
  hashtbl_node_t *phStack_48;
  cf_uint32_t hash;
  cf_size_t len_local;
  cf_void_t *key_local;
  cf_hashtbl_t *tbl_local;
  cf_uint8_t *pcStack_28;
  cf_uint32_t hash_1;
  cf_uint8_t *end;
  cf_uint8_t *p;
  cf_void_t *local_10;
  
  local_68 = (hashtbl_node_t **)0x0;
  p = (cf_uint8_t *)&stack0xffffffffffffffb8;
  pcStack_28 = (cf_uint8_t *)0x0;
  tbl_local._4_4_ = 0;
  len_local = (cf_size_t)key;
  key_local = tbl;
  end = (cf_uint8_t *)key;
  local_10 = key;
  if (len == 0xffffffffffffffff) {
    phStack_48 = (hashtbl_node_t *)0x0;
    while (*end != '\0') {
      tbl_local._4_4_ = tbl_local._4_4_ * 0x21 + (uint)*end;
      end = end + 1;
      *(long *)p = *(long *)p + 1;
    }
    *(long *)p = *(long *)p + 1;
  }
  else {
    pcStack_28 = (cf_uint8_t *)((long)key + len);
    for (; phStack_48 = (hashtbl_node_t *)len, end != pcStack_28; end = end + 1) {
      tbl_local._4_4_ = tbl_local._4_4_ * 0x21 + (uint)*end;
    }
  }
  uVar1 = tbl_local._4_4_ & *(uint *)((long)key_local + 0x10);
  plVar3 = (long *)(*key_local + (ulong)uVar1 * 8);
  list_entry = (hashtbl_node_t **)*plVar3;
  while( true ) {
    if (list_entry == (hashtbl_node_t **)0x0) {
      return;
    }
    if ((((*(uint *)(list_entry + 2) == uVar1) && (list_entry[4] == phStack_48)) &&
        (list_entry[3] != (hashtbl_node_t *)0x0)) &&
       (iVar2 = memcmp(list_entry[3],(void *)len_local,(size_t)phStack_48), iVar2 == 0)) break;
    local_68 = list_entry;
    list_entry = (hashtbl_node_t **)list_entry[1];
  }
  if ((hashtbl_node_t **)*plVar3 == list_entry) {
    *plVar3 = (long)list_entry[1];
  }
  else {
    local_68[1] = list_entry[1];
  }
  if (*(long *)((long)key_local + 0x18) != 0) {
    (**(code **)((long)key_local + 0x18))(list_entry[5]);
  }
  free(list_entry[3]);
  free(list_entry);
  *(long *)((long)key_local + 8) = *(long *)((long)key_local + 8) + -1;
  return;
}

Assistant:

cf_void_t hashtbl_remove_node(cf_hashtbl_t* tbl, const cf_void_t* key, cf_size_t len) {
    cf_uint32_t hash = 0;
    hashtbl_node_t* node = CF_NULL_PTR, **list_entry = CF_NULL_PTR, *prev = CF_NULL_PTR;

    hash = cf_hashtbl_calc_hash(key, &len) & tbl->hashmsk;

    for (list_entry = &tbl->table[hash], node = *list_entry;
         node;
         prev = node, node = node->next) {
        if (node->hash == hash && node->keylen == len
            && node->key != CF_NULL_PTR && memcmp(node->key, key, len) == 0) {
            if (*list_entry == node) {
                *list_entry = node->next;
            } else {
                prev->next = node->next;   
            }
            if (tbl->callback) {
                tbl->callback(node->value);
            }
            cf_free_native(node->key);
            cf_free_native(node);

            tbl->size--;
            return;
        }
    }
}